

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_resolveFlattenNonCircularImportsUnits_Test::TestBody
          (ModelFlattening_resolveFlattenNonCircularImportsUnits_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  char *pcVar4;
  ModelPtr flatModel;
  unsigned_long local_b8;
  unsigned_long local_b0;
  AssertionResult gtest_ar_;
  ImportSourcePtr importSource;
  UnitsPtr fancyUnits;
  ModelPtr importModel;
  ModelPtr model;
  UnitsPtr importedUnit;
  UnitsPtr perBecquerel;
  UnitsPtr unitsWithImportedUnit;
  ImporterPtr importer;
  
  libcellml::Importer::create(SUB81(&importer,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"model",(allocator<char> *)&importModel);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"importModel",(allocator<char> *)&unitsWithImportedUnit);
  libcellml::Model::create((string *)&importModel);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"one_imported_unit",(allocator<char> *)&fancyUnits);
  libcellml::Units::create((string *)&unitsWithImportedUnit);
  std::__cxx11::string::~string((string *)&flatModel);
  peVar2 = unitsWithImportedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"metre",(allocator<char> *)&fancyUnits);
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"importedUnit",(allocator<char> *)&fancyUnits);
  libcellml::Units::addUnit
            ((string *)
             unitsWithImportedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"fancyUnits",(allocator<char> *)&perBecquerel);
  libcellml::Units::create((string *)&fancyUnits);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"per_becquerel",(allocator<char> *)&perBecquerel);
  libcellml::Units::addUnit
            ((string *)
             fancyUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&flatModel);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"per_becquerel",(allocator<char> *)&importSource);
  libcellml::Units::create((string *)&perBecquerel);
  std::__cxx11::string::~string((string *)&flatModel);
  pcVar4 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"",(allocator<char> *)&importSource);
  libcellml::Units::addUnit
            ((StandardUnit)
             perBecquerel.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             -1.0,(string *)0x1);
  std::__cxx11::string::~string((string *)&flatModel);
  libcellml::Model::addUnits
            ((shared_ptr *)
             importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::ImportSource::create();
  peVar1 = importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"here.cellml",(allocator<char> *)&importedUnit);
  libcellml::ImportSource::setUrl((string *)peVar1);
  std::__cxx11::string::~string((string *)&flatModel);
  libcellml::ImportSource::setModel
            ((shared_ptr *)
             importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"importedUnit",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&importedUnit);
  std::__cxx11::string::~string((string *)&flatModel);
  peVar2 = importedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flatModel,"fancyUnits",(allocator<char> *)&gtest_ar_);
  libcellml::ImportedEntity::setImportReference((string *)(peVar2 + 0x10));
  std::__cxx11::string::~string((string *)&flatModel);
  libcellml::ImportedEntity::setImportSource
            ((shared_ptr *)
             (importedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             0x10));
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar3 = libcellml::Model::hasUnresolvedImports();
  gtest_ar_.success_ = (bool)(bVar3 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&flatModel,&gtest_ar_.success_,"model->hasUnresolvedImports()",
               "true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x38e,(char *)flatModel.
                              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    std::__cxx11::string::~string((string *)&flatModel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  libcellml::Importer::flattenModel((shared_ptr *)&flatModel);
  local_b8 = 0;
  local_b0 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_,"size_t(0)","importer->issueCount()",&local_b8,&local_b0);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x391,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&perBecquerel.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fancyUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsWithImportedUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenNonCircularImportsUnits)
{
    auto importer = libcellml::Importer::create();
    auto model = libcellml::Model::create("model");
    auto importModel = libcellml::Model::create("importModel");

    auto unitsWithImportedUnit = libcellml::Units::create("one_imported_unit");
    unitsWithImportedUnit->addUnit("metre");
    unitsWithImportedUnit->addUnit("importedUnit");

    auto fancyUnits = libcellml::Units::create("fancyUnits");
    fancyUnits->addUnit("per_becquerel");

    auto perBecquerel = libcellml::Units::create("per_becquerel");
    perBecquerel->addUnit(libcellml::Units::StandardUnit::BECQUEREL, -1.0);

    importModel->addUnits(fancyUnits);
    importModel->addUnits(perBecquerel);

    auto importSource = libcellml::ImportSource::create();
    importSource->setUrl("here.cellml");
    importSource->setModel(importModel);

    auto importedUnit = libcellml::Units::create("importedUnit");
    importedUnit->setImportReference("fancyUnits");
    importedUnit->setImportSource(importSource);

    model->addUnits(unitsWithImportedUnit);
    model->addUnits(importedUnit);

    EXPECT_FALSE(model->hasUnresolvedImports());

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(0), importer->issueCount());
}